

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.h
# Opt level: O2

void __thiscall vec<vec<Propagator_*>_>::~vec(vec<vec<Propagator_*>_> *this)

{
  long lVar1;
  uint i;
  ulong uVar2;
  
  lVar1 = 0;
  for (uVar2 = 0; uVar2 < this->sz; uVar2 = uVar2 + 1) {
    vec<Propagator_*>::~vec((vec<Propagator_*> *)((long)&this->data->sz + lVar1));
    lVar1 = lVar1 + 0x10;
  }
  free(this->data);
  this->data = (vec<Propagator_*> *)0x0;
  return;
}

Assistant:

~vec() {
		for (unsigned int i = 0; i < sz; i++) {
			data[i].~T();
		}
		if (data) {
			free(data);
		}
		data = nullptr;
	}